

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_paeth_predictor_16x8_ssse3(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong *in_RCX;
  long in_RSI;
  undefined8 *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar3 [16];
  __m128i *extraout_XMM0_Qb;
  __m128i row;
  __m128i l16;
  int i;
  __m128i one;
  __m128i rep;
  __m128i tl16;
  __m128i top1;
  __m128i top0;
  __m128i zero;
  __m128i t;
  __m128i l;
  __m128i *in_stack_fffffffffffffde0;
  __m128i *in_stack_fffffffffffffdf8;
  int local_1fc;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 *local_160;
  short local_c8;
  short sStack_c6;
  short sStack_c4;
  short sStack_c2;
  short sStack_c0;
  short sStack_be;
  short sStack_bc;
  short sStack_ba;
  
  uVar1 = *in_RCX;
  local_1e8 = 0x8000800080008000;
  uStack_1e0 = 0x8000800080008000;
  local_160 = in_RDI;
  for (local_1fc = 0; local_1fc < 8; local_1fc = local_1fc + 1) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    auVar3._8_8_ = uStack_1e0;
    auVar3._0_8_ = local_1e8;
    auVar3 = pshufb(auVar2,auVar3);
    paeth_16x1_pred(in_stack_fffffffffffffdf8,auVar3._8_8_,auVar3._0_8_,in_stack_fffffffffffffde0);
    *local_160 = extraout_XMM0_Qa;
    local_160[1] = extraout_XMM0_Qb;
    local_160 = (undefined8 *)(in_RSI + (long)local_160);
    local_c8 = (short)local_1e8;
    sStack_c6 = (short)((ulong)local_1e8 >> 0x10);
    sStack_c4 = (short)((ulong)local_1e8 >> 0x20);
    sStack_c2 = (short)((ulong)local_1e8 >> 0x30);
    sStack_c0 = (short)uStack_1e0;
    sStack_be = (short)((ulong)uStack_1e0 >> 0x10);
    sStack_bc = (short)((ulong)uStack_1e0 >> 0x20);
    sStack_ba = (short)((ulong)uStack_1e0 >> 0x30);
    local_1e8 = CONCAT26(sStack_c2 + 1,CONCAT24(sStack_c4 + 1,CONCAT22(sStack_c6 + 1,local_c8 + 1)))
    ;
    uStack_1e0 = CONCAT26(sStack_ba + 1,
                          CONCAT24(sStack_bc + 1,CONCAT22(sStack_be + 1,sStack_c0 + 1)));
    in_stack_fffffffffffffde0 = extraout_XMM0_Qb;
  }
  return;
}

Assistant:

void aom_paeth_predictor_16x8_ssse3(uint8_t *dst, ptrdiff_t stride,
                                    const uint8_t *above, const uint8_t *left) {
  __m128i l = _mm_loadl_epi64((const __m128i *)left);
  const __m128i t = _mm_load_si128((const __m128i *)above);
  const __m128i zero = _mm_setzero_si128();
  const __m128i top0 = _mm_unpacklo_epi8(t, zero);
  const __m128i top1 = _mm_unpackhi_epi8(t, zero);
  const __m128i tl16 = _mm_set1_epi16((int16_t)above[-1]);
  __m128i rep = _mm_set1_epi16((short)0x8000);
  const __m128i one = _mm_set1_epi16(1);

  int i;
  for (i = 0; i < 8; ++i) {
    const __m128i l16 = _mm_shuffle_epi8(l, rep);
    const __m128i row = paeth_16x1_pred(&l16, &top0, &top1, &tl16);

    _mm_store_si128((__m128i *)dst, row);
    dst += stride;
    rep = _mm_add_epi16(rep, one);
  }
}